

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O3

void __thiscall amrex::Amr::~Amr(Amr *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer piVar3;
  pointer pdVar4;
  long lVar5;
  undefined8 uVar6;
  
  (this->super_AmrCore).super_AmrMesh._vptr_AmrMesh = (_func_int **)&PTR__Amr_0080dac8;
  (**(code **)(*(long *)this->levelbld + 0x20))();
  Finalize();
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_double>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  ::~_Rb_tree(&(this->intersect_hiz)._M_t);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_double>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  ::~_Rb_tree(&(this->intersect_hiy)._M_t);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_double>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  ::~_Rb_tree(&(this->intersect_hix)._M_t);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_double>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  ::~_Rb_tree(&(this->intersect_loz)._M_t);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_double>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  ::~_Rb_tree(&(this->intersect_loy)._M_t);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_double>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  ::~_Rb_tree(&(this->intersect_lox)._M_t);
  pcVar2 = (this->probin_file)._M_dataplus._M_p;
  paVar1 = &(this->probin_file).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->restart_pltfile)._M_dataplus._M_p;
  paVar1 = &(this->restart_pltfile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->restart_chkfile)._M_dataplus._M_p;
  paVar1 = &(this->restart_chkfile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->datalogname).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  std::
  vector<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
  ::~vector(&(this->datalog).
             super_vector<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
           );
  uVar6 = __M_insert<void_const*>;
  lVar5 = _VTT;
  *(long *)&this->runlog_terse = _VTT;
  *(undefined8 *)(&this->runlog_terse + *(long *)(lVar5 + -0x18)) = uVar6;
  std::filebuf::~filebuf((filebuf *)&this->field_0x6d8);
  std::ios_base::~ios_base((ios_base *)&this->field_0x7c8);
  *(long *)&this->runlog = lVar5;
  *(undefined8 *)(&this->runlog + *(long *)(lVar5 + -0x18)) = uVar6;
  std::filebuf::~filebuf((filebuf *)&this->field_0x4d8);
  std::ios_base::~ios_base((ios_base *)&this->field_0x5c8);
  *(long *)&this->gridlog = lVar5;
  *(undefined8 *)(&this->gridlog + *(long *)(lVar5 + -0x18)) = uVar6;
  std::filebuf::~filebuf((filebuf *)&this->field_0x2d8);
  std::ios_base::~ios_base((ios_base *)&this->field_0x3c8);
  pcVar2 = (this->small_plot_file_root)._M_dataplus._M_p;
  paVar1 = &(this->small_plot_file_root).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->plot_file_root)._M_dataplus._M_p;
  paVar1 = &(this->plot_file_root).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->check_file_root)._M_dataplus._M_p;
  paVar1 = &(this->check_file_root).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  piVar3 = (this->regrid_int).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3,(long)(this->regrid_int).super_vector<int,_std::allocator<int>_>.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar3);
  }
  pdVar4 = (this->dt_min).super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4,(long)(this->dt_min).super_vector<double,_std::allocator<double>_>.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar4);
  }
  pcVar2 = (this->subcycling_mode)._M_dataplus._M_p;
  paVar1 = &(this->subcycling_mode).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  piVar3 = (this->n_cycle).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3,(long)(this->n_cycle).super_vector<int,_std::allocator<int>_>.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar3);
  }
  piVar3 = (this->level_count).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3,(long)(this->level_count).super_vector<int,_std::allocator<int>_>.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar3);
  }
  piVar3 = (this->level_steps).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3,(long)(this->level_steps).super_vector<int,_std::allocator<int>_>.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar3);
  }
  pdVar4 = (this->dt_level).super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4,(long)(this->dt_level).super_vector<double,_std::allocator<double>_>.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar4);
  }
  std::
  vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  ::~vector(&(this->amr_level).
             super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           );
  pcVar2 = (this->initial_grids_file)._M_dataplus._M_p;
  paVar1 = &(this->initial_grids_file).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->regrid_grids_file)._M_dataplus._M_p;
  paVar1 = &(this->regrid_grids_file).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  AmrCore::~AmrCore(&this->super_AmrCore);
  return;
}

Assistant:

Amr::~Amr ()
{
    levelbld->variableCleanUp();

    Amr::Finalize();
}